

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     swap_offsets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
               uchar *offsets_l,uchar *offsets_r,size_t num,bool use_swaps)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a;
  reference piVar1;
  ulong in_R8;
  byte in_R9B;
  size_t i_1;
  T tmp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> r;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> l;
  size_t i;
  undefined4 in_stack_ffffffffffffff78;
  int iVar2;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar3;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff88;
  ulong local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  int *local_48;
  int *local_40;
  ulong local_38;
  byte local_29;
  ulong local_28;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  if (local_29 == 0) {
    if (in_R8 != 0) {
      local_50 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator+(in_stack_ffffffffffffff88._M_current,
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      local_58 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator-(in_stack_ffffffffffffff88._M_current,
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      piVar1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_50);
      iVar2 = *piVar1;
      piVar1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_58);
      iVar4 = *piVar1;
      piVar1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_50);
      *piVar1 = iVar4;
      for (local_68 = 1; local_68 < local_28; local_68 = local_68 + 1) {
        local_50 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator+(in_stack_ffffffffffffff88._M_current,
                             CONCAT44(iVar4,in_stack_ffffffffffffff80));
        piVar1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_50);
        iVar3 = *piVar1;
        piVar1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_58);
        *piVar1 = iVar3;
        in_stack_ffffffffffffff88 =
             __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                       (in_stack_ffffffffffffff88._M_current,
                        CONCAT44(iVar4,in_stack_ffffffffffffff80));
        local_58 = in_stack_ffffffffffffff88;
        piVar1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_58);
        in_stack_ffffffffffffff80 = *piVar1;
        piVar1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_50);
        *piVar1 = in_stack_ffffffffffffff80;
      }
      piVar1 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_58);
      *piVar1 = iVar2;
    }
  }
  else {
    for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
      local_40 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_ffffffffffffff88._M_current,
                                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      local_48 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator-(in_stack_ffffffffffffff88._M_current,
                                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      __a._M_current._4_4_ = in_stack_ffffffffffffff84;
      __a._M_current._0_4_ = in_stack_ffffffffffffff80;
      __b._M_current._4_4_ = in_stack_ffffffffffffff7c;
      __b._M_current._0_4_ = in_stack_ffffffffffffff78;
      std::
      iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (__a,__b);
    }
  }
  return;
}

Assistant:

inline void swap_offsets(Iter first, Iter last,
                             unsigned char* offsets_l, unsigned char* offsets_r,
                             size_t num, bool use_swaps) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (use_swaps) {
            // This case is needed for the descending distribution, where we need
            // to have proper swapping for pdqsort to remain O(n).
            for (size_t i = 0; i < num; ++i) {
                std::iter_swap(first + offsets_l[i], last - offsets_r[i]);
            }
        } else if (num > 0) {
            Iter l = first + offsets_l[0]; Iter r = last - offsets_r[0];
            T tmp(PDQSORT_PREFER_MOVE(*l)); *l = PDQSORT_PREFER_MOVE(*r);
            for (size_t i = 1; i < num; ++i) {
                l = first + offsets_l[i]; *r = PDQSORT_PREFER_MOVE(*l);
                r = last - offsets_r[i]; *l = PDQSORT_PREFER_MOVE(*r);
            }
            *r = PDQSORT_PREFER_MOVE(tmp);
        }
    }